

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O0

size_t polyscope::pick::localIndexToGlobal(pair<polyscope::Structure_*,_unsigned_long> localPick)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> _Var1;
  bool bVar2;
  _Node_iterator_base<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_false>
  message;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long>_> *p_Var3;
  long in_RSI;
  long in_RDI;
  size_t rangeEnd;
  size_t rangeStart;
  tuple<unsigned_long,_unsigned_long> range;
  allocator *in_stack_ffffffffffffff78;
  unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff80;
  allocator local_49;
  string local_48 [32];
  _Node_iterator_base<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_false>
  local_28;
  size_t local_8;
  
  if (in_RDI == 0) {
    local_8 = 0;
  }
  else {
    message._M_cur =
         (__node_type *)
         std::
         unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
         ::find((unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
                 *)in_stack_ffffffffffffff78,(key_type *)0x3ec9eb);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
         ::end((unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
                *)in_stack_ffffffffffffff78);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>,_false>
                        *)&stack0xffffffffffffffe0,&local_28);
    if (bVar2) {
      in_stack_ffffffffffffff78 = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"structure does not match any allocated pick range",
                 in_stack_ffffffffffffff78);
      exception((string *)message._M_cur);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    std::
    unordered_map<polyscope::Structure_*,_std::tuple<unsigned_long,_unsigned_long>,_std::hash<polyscope::Structure_*>,_std::equal_to<polyscope::Structure_*>,_std::allocator<std::pair<polyscope::Structure_*const,_std::tuple<unsigned_long,_unsigned_long>_>_>_>
    ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
    p_Var3 = std::get<0ul,unsigned_long,unsigned_long>
                       ((tuple<unsigned_long,_unsigned_long> *)0x3ecabd);
    _Var1 = *p_Var3;
    std::get<1ul,unsigned_long,unsigned_long>((tuple<unsigned_long,_unsigned_long> *)0x3ecacf);
    local_8 = _Var1 + in_RSI;
  }
  return local_8;
}

Assistant:

size_t localIndexToGlobal(std::pair<Structure*, size_t> localPick) {
  if (localPick.first == nullptr) return 0;

  if (structureRanges.find(localPick.first) == structureRanges.end()) {
    exception("structure does not match any allocated pick range");
  }

  std::tuple<size_t, size_t> range = structureRanges[localPick.first];
  size_t rangeStart = std::get<0>(range);
  size_t rangeEnd = std::get<1>(range);
  return rangeStart + localPick.second;
}